

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

void cimg_library::CImg<unsigned_char>::_load_inr_header(FILE *file,int *out,float *voxel_size)

{
  char cVar1;
  int iVar2;
  long lVar3;
  CImgIOException *this;
  char cVar4;
  char cVar5;
  CImg<char> item;
  CImg<char> tmp1;
  CImg<char> tmp2;
  CImg<char> local_d0;
  int *local_b0;
  int *local_a8;
  int *local_a0;
  int *local_98;
  FILE *local_90;
  CImg<char> local_88;
  CImg<char> local_68;
  float *local_48;
  float *local_40;
  float *local_38;
  
  local_90 = file;
  CImg<char>::CImg(&local_d0,0x400,1,1,1);
  CImg<char>::CImg(&local_88,0x40,1,1,1);
  CImg<char>::CImg(&local_68,0x40,1,1,1);
  *local_68._data = '\0';
  *local_88._data = '\0';
  *local_d0._data = '\0';
  __isoc99_fscanf(local_90,"%63s",local_d0._data);
  out[0] = 1;
  out[1] = 1;
  out[2] = 1;
  out[3] = 1;
  out[4] = -1;
  out[5] = 1;
  out[6] = -1;
  out[7] = -1;
  if (local_d0._data == (char *)0x0) {
LAB_001ad4ad:
    this = (CImgIOException *)__cxa_allocate_exception(0x10);
    CImgIOException::CImgIOException
              (this,"CImg<%s>::load_inr(): INRIMAGE-4 header not found.","unsigned char");
  }
  else {
    local_a0 = out + 3;
    local_a8 = out + 2;
    local_98 = out + 1;
    local_b0 = out + 6;
    lVar3 = 0;
    do {
      cVar1 = local_d0._data[lVar3];
      cVar4 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar4 = cVar1;
      }
      cVar1 = "#INRIMAGE-4#{"[lVar3];
      cVar5 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar5 = cVar1;
      }
      if (cVar4 != cVar5) {
        if ((int)lVar3 != 0xd) goto LAB_001ad4ad;
        break;
      }
      lVar3 = lVar3 + 1;
    } while ((int)lVar3 != 0xd);
    local_40 = voxel_size + 1;
    local_48 = voxel_size + 2;
    local_38 = voxel_size;
LAB_001acfb6:
    do {
      do {
        iVar2 = __isoc99_fscanf(local_90," %63[^\n]%*c",local_d0._data);
        if ((iVar2 == -1) ||
           (((*local_d0._data == '#' && (local_d0._data[1] == '#')) && (local_d0._data[2] == '}'))))
        {
          if ((((*out < 0) || (*local_98 < 0)) || (*local_a8 < 0)) || (*local_a0 < 0)) {
            this = (CImgIOException *)__cxa_allocate_exception(0x10);
            CImgIOException::CImgIOException
                      (this,
                       "CImg<%s>::load_inr(): Invalid dimensions (%d,%d,%d,%d) defined in header.",
                       "unsigned char",(ulong)(uint)*out,(ulong)(uint)out[1],(ulong)(uint)out[2],
                       out[3]);
          }
          else if ((out[4] < 0) || (out[5] < 0)) {
            this = (CImgIOException *)__cxa_allocate_exception(0x10);
            CImgIOException::CImgIOException
                      (this,"CImg<%s>::load_inr(): Incomplete pixel type defined in header.",
                       "unsigned char");
          }
          else if (*local_b0 < 0) {
            this = (CImgIOException *)__cxa_allocate_exception(0x10);
            CImgIOException::CImgIOException
                      (this,"CImg<%s>::load_inr(): Incomplete PIXSIZE field defined in header.",
                       "unsigned char");
          }
          else {
            if (-1 < out[7]) {
              if ((local_68._is_shared == false) && (local_68._data != (char *)0x0)) {
                operator_delete__(local_68._data);
              }
              if ((local_88._is_shared == false) && (local_88._data != (char *)0x0)) {
                operator_delete__(local_88._data);
              }
              if ((local_d0._is_shared == false) && (local_d0._data != (char *)0x0)) {
                operator_delete__(local_d0._data);
              }
              return;
            }
            this = (CImgIOException *)__cxa_allocate_exception(0x10);
            CImgIOException::CImgIOException
                      (this,
                       "CImg<%s>::load_inr(): Big/Little Endian coding type undefined in header.",
                       "unsigned char");
          }
          goto LAB_001ad439;
        }
        __isoc99_sscanf(local_d0._data," XDIM%*[^0-9]%d",out);
        __isoc99_sscanf(local_d0._data," YDIM%*[^0-9]%d",local_98);
        __isoc99_sscanf(local_d0._data," ZDIM%*[^0-9]%d",local_a8);
        __isoc99_sscanf(local_d0._data," VDIM%*[^0-9]%d",local_a0);
        __isoc99_sscanf(local_d0._data," PIXSIZE%*[^0-9]%d",local_b0);
        if (local_38 != (float *)0x0) {
          __isoc99_sscanf(local_d0._data," VX%*[^0-9.+-]%f");
          __isoc99_sscanf(local_d0._data," VY%*[^0-9.+-]%f",local_40);
          __isoc99_sscanf(local_d0._data," VZ%*[^0-9.+-]%f",local_48);
        }
        iVar2 = __isoc99_sscanf(local_d0._data," CPU%*[ =]%s",local_88._data);
        if (iVar2 != 0) {
          iVar2 = 0;
          if (local_88._data != (char *)0x0) {
            lVar3 = 0;
            do {
              cVar1 = local_88._data[lVar3];
              cVar4 = cVar1 + ' ';
              if ((byte)(cVar1 + 0xa5U) < 0xe6) {
                cVar4 = cVar1;
              }
              cVar1 = "sun"[lVar3];
              cVar5 = cVar1 + ' ';
              if ((byte)(cVar1 + 0xa5U) < 0xe6) {
                cVar5 = cVar1;
              }
              if (cVar4 != cVar5) {
                if ((int)lVar3 != 3) goto LAB_001ad125;
                break;
              }
              lVar3 = lVar3 + 1;
            } while ((int)lVar3 != 3);
            iVar2 = 1;
          }
LAB_001ad125:
          out[7] = iVar2;
        }
        iVar2 = __isoc99_sscanf(local_d0._data," TYPE%*[ =]%s %s");
      } while (iVar2 == 0);
      if (iVar2 != 1) {
        if (iVar2 != 2) break;
        iVar2 = 1;
        if (local_88._data != (char *)0x0) {
          lVar3 = 0;
          do {
            cVar1 = local_88._data[lVar3];
            cVar4 = cVar1 + ' ';
            if ((byte)(cVar1 + 0xa5U) < 0xe6) {
              cVar4 = cVar1;
            }
            cVar1 = "unsigned"[lVar3];
            cVar5 = cVar1 + ' ';
            if ((byte)(cVar1 + 0xa5U) < 0xe6) {
              cVar5 = cVar1;
            }
            if (cVar4 != cVar5) {
              if ((int)lVar3 != 8) goto LAB_001ad1af;
              break;
            }
            lVar3 = lVar3 + 1;
          } while ((int)lVar3 != 8);
          iVar2 = 0;
        }
LAB_001ad1af:
        out[5] = iVar2;
        strncpy(local_88._data,local_68._data,(ulong)(local_88._width - 1));
      }
      if (local_88._data != (char *)0x0) {
        lVar3 = 0;
        do {
          cVar1 = local_88._data[lVar3];
          cVar4 = cVar1 + ' ';
          if ((byte)(cVar1 + 0xa5U) < 0xe6) {
            cVar4 = cVar1;
          }
          cVar1 = "unsigned int"[lVar3 + 9];
          cVar5 = cVar1 + ' ';
          if ((byte)(cVar1 + 0xa5U) < 0xe6) {
            cVar5 = cVar1;
          }
          if (cVar4 != cVar5) {
            if ((int)lVar3 != 3) {
              lVar3 = 0;
              goto LAB_001ad217;
            }
            break;
          }
          lVar3 = lVar3 + 1;
        } while ((int)lVar3 != 3);
        goto LAB_001ad25d;
      }
LAB_001ad33f:
    } while (-1 < out[4]);
    this = (CImgIOException *)__cxa_allocate_exception(0x10);
    CImgIOException::CImgIOException
              (this,"CImg<%s>::load_inr(): Invalid pixel type \'%s\' defined in header.",
               "unsigned char",local_68._data);
  }
LAB_001ad439:
  __cxa_throw(this,&CImgIOException::typeinfo,CImgException::~CImgException);
  while (lVar3 = lVar3 + 1, (int)lVar3 != 5) {
LAB_001ad217:
    cVar1 = local_88._data[lVar3];
    cVar4 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar4 = cVar1;
    }
    cVar1 = "fixed"[lVar3];
    cVar5 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar5 = cVar1;
    }
    if (cVar4 != cVar5) {
      if ((int)lVar3 != 5) goto LAB_001ad264;
      break;
    }
  }
LAB_001ad25d:
  out[4] = 0;
LAB_001ad264:
  lVar3 = 0;
  do {
    cVar1 = local_88._data[lVar3];
    cVar4 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar4 = cVar1;
    }
    cVar1 = "GL_NV_shader_atomic_float"[lVar3 + 0x14];
    cVar5 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar5 = cVar1;
    }
    if (cVar4 != cVar5) {
      if ((int)lVar3 != 5) {
        lVar3 = 0;
        goto LAB_001ad2a8;
      }
      break;
    }
    lVar3 = lVar3 + 1;
  } while ((int)lVar3 != 5);
LAB_001ad2ee:
  out[4] = 1;
LAB_001ad2f5:
  lVar3 = 0;
  do {
    cVar1 = local_88._data[lVar3];
    cVar4 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar4 = cVar1;
    }
    cVar1 = "packed"[lVar3];
    cVar5 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar5 = cVar1;
    }
    if (cVar4 != cVar5) {
      if ((int)lVar3 != 6) goto LAB_001ad33f;
      break;
    }
    lVar3 = lVar3 + 1;
  } while ((int)lVar3 != 6);
  out[4] = 2;
  goto LAB_001acfb6;
  while (lVar3 = lVar3 + 1, (int)lVar3 != 6) {
LAB_001ad2a8:
    cVar1 = local_88._data[lVar3];
    cVar4 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar4 = cVar1;
    }
    cVar1 = "double"[lVar3];
    cVar5 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar5 = cVar1;
    }
    if (cVar4 != cVar5) {
      if ((int)lVar3 != 6) goto LAB_001ad2f5;
      break;
    }
  }
  goto LAB_001ad2ee;
}

Assistant:

static void _load_inr_header(std::FILE *file, int out[8], float *const voxel_size) {
      CImg<charT> item(1024), tmp1(64), tmp2(64);
      *item = *tmp1 = *tmp2 = 0;
      out[0] = std::fscanf(file,"%63s",item._data);
      out[0] = out[1] = out[2] = out[3] = out[5] = 1; out[4] = out[6] = out[7] = -1;
      if (cimg::strncasecmp(item,"#INRIMAGE-4#{",13)!=0)
        throw CImgIOException("CImg<%s>::load_inr(): INRIMAGE-4 header not found.",
                              pixel_type());

      while (std::fscanf(file," %63[^\n]%*c",item._data)!=EOF && std::strncmp(item,"##}",3)) {
        cimg_sscanf(item," XDIM%*[^0-9]%d",out);
        cimg_sscanf(item," YDIM%*[^0-9]%d",out + 1);
        cimg_sscanf(item," ZDIM%*[^0-9]%d",out + 2);
        cimg_sscanf(item," VDIM%*[^0-9]%d",out + 3);
        cimg_sscanf(item," PIXSIZE%*[^0-9]%d",out + 6);
        if (voxel_size) {
          cimg_sscanf(item," VX%*[^0-9.+-]%f",voxel_size);
          cimg_sscanf(item," VY%*[^0-9.+-]%f",voxel_size + 1);
          cimg_sscanf(item," VZ%*[^0-9.+-]%f",voxel_size + 2);
        }
        if (cimg_sscanf(item," CPU%*[ =]%s",tmp1._data)) out[7] = cimg::strncasecmp(tmp1,"sun",3)?0:1;
        switch (cimg_sscanf(item," TYPE%*[ =]%s %s",tmp1._data,tmp2._data)) {
        case 0 : break;
        case 2 :
          out[5] = cimg::strncasecmp(tmp1,"unsigned",8)?1:0;
          std::strncpy(tmp1,tmp2,tmp1._width - 1); // fallthrough
        case 1 :
          if (!cimg::strncasecmp(tmp1,"int",3) || !cimg::strncasecmp(tmp1,"fixed",5))  out[4] = 0;
          if (!cimg::strncasecmp(tmp1,"float",5) || !cimg::strncasecmp(tmp1,"double",6)) out[4] = 1;
          if (!cimg::strncasecmp(tmp1,"packed",6)) out[4] = 2;
          if (out[4]>=0) break; // fallthrough
        default :
          throw CImgIOException("CImg<%s>::load_inr(): Invalid pixel type '%s' defined in header.",
                                pixel_type(),
                                tmp2._data);
        }
      }
      if (out[0]<0 || out[1]<0 || out[2]<0 || out[3]<0)
        throw CImgIOException("CImg<%s>::load_inr(): Invalid dimensions (%d,%d,%d,%d) defined in header.",
                              pixel_type(),
                              out[0],out[1],out[2],out[3]);
      if (out[4]<0 || out[5]<0)
        throw CImgIOException("CImg<%s>::load_inr(): Incomplete pixel type defined in header.",
                              pixel_type());
      if (out[6]<0)
        throw CImgIOException("CImg<%s>::load_inr(): Incomplete PIXSIZE field defined in header.",
                              pixel_type());
      if (out[7]<0)
        throw CImgIOException("CImg<%s>::load_inr(): Big/Little Endian coding type undefined in header.",
                              pixel_type());
    }